

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

int bfgs_min_naive(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                  double fsval,double maxstep,int MAXITER,double eps,double *xf)

{
  int iVar1;
  int iVar2;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *H;
  double *L_00;
  double *f_00;
  double gtol_00;
  double eps2_00;
  double dVar3;
  double dVar4;
  double *jacf;
  double *step;
  double *L;
  double *xc;
  double *scheck;
  double *hess;
  double *jac;
  double eps2;
  double fxf;
  double stop0;
  double den;
  double num;
  double fx;
  double dt2;
  double dt1;
  double stol;
  double gtol;
  int retval;
  int siter;
  int i;
  int gfdcode;
  int iter;
  int rcode;
  double eps_local;
  double dStack_48;
  int MAXITER_local;
  double maxstep_local;
  double fsval_local;
  double *dx_local;
  int N_local;
  double *xi_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  f = (double *)malloc((long)N << 3);
  array = (double *)malloc((long)N << 3);
  xi_00 = (double *)malloc((long)N << 3);
  x = (double *)malloc((long)N << 3);
  H = (double *)malloc((long)N * 8 * (long)N);
  L_00 = (double *)malloc((long)N * 8 * (long)N);
  f_00 = (double *)malloc((long)N << 3);
  gfdcode = 0;
  i = 0;
  gtol_00 = pow(eps,0.3333333333333333);
  eps2_00 = sqrt(eps);
  for (retval = 0; retval < N; retval = retval + 1) {
    xi[retval] = dx[retval] * xi[retval];
    dx[retval] = 1.0 / dx[retval];
  }
  dVar3 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if ((1.79769313486232e+308 <= dVar3) || (dVar3 <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    gfdcode = 0xf;
  }
  if (NAN(dVar3)) {
    printf("Program Exiting as the function returns NaN");
    gfdcode = 0xf;
  }
  iVar1 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2_00,f);
  if (iVar1 == 0xf) {
    gfdcode = 0xf;
  }
  dStack_48 = maxstep;
  if (maxstep <= 0.0) {
    fx = 0.0;
    dt2 = 0.0;
    for (retval = 0; retval < N; retval = retval + 1) {
      dt2 = dx[retval] * dx[retval] + dt2;
      fx = dx[retval] * xi[retval] * dx[retval] * xi[retval] + fx;
    }
    dVar4 = sqrt(dt2);
    dStack_48 = sqrt(fx);
    if (dStack_48 < dVar4) {
      dStack_48 = dVar4;
    }
    dStack_48 = dStack_48 * 1000.0;
  }
  if (ABS(dVar3) <= ABS(fsval)) {
    stop0 = ABS(fsval);
  }
  else {
    stop0 = ABS(dVar3);
  }
  for (retval = 0; retval < N; retval = retval + 1) {
    if (ABS(xi[retval]) <= 1.0 / ABS(dx[retval])) {
      den = 1.0 / ABS(dx[retval]);
    }
    else {
      den = ABS(xi[retval]);
    }
    array[retval] = (ABS(f[retval]) * den) / stop0;
  }
  dVar4 = array_max_abs(array,N);
  if (gtol_00 * 0.001 < dVar4) {
    inithess_naive(H,N,dVar3,fsval,dx);
    for (retval = 0; retval < N; retval = retval + 1) {
      xi_00[retval] = xi[retval];
    }
    while (gfdcode == 0 && i < MAXITER) {
      i = i + 1;
      modelhess(H,N,dx,eps,L_00);
      scale(f,1,N,-1.0);
      linsolve_lower(L_00,N,f,x);
      scale(f,1,N,-1.0);
      iVar1 = lnsrch(funcpt,xi_00,f,x,N,dx,dStack_48,gtol_00 * gtol_00,xf);
      dVar3 = (*funcpt->funcpt)(xf,N,funcpt->params);
      if ((1.79769313486232e+308 <= dVar3) || (dVar3 <= -1.79769313486232e+308)) {
        printf("Program Exiting as the function value exceeds the maximum double value");
        gfdcode = 0xf;
        break;
      }
      if (NAN(dVar3)) {
        printf("Program Exiting as the function returns NaN");
        gfdcode = 0xf;
        break;
      }
      iVar2 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2_00,f_00);
      if (iVar2 == 0xf) {
        gfdcode = 0xf;
        break;
      }
      gfdcode = stopcheck(dVar3,N,xi_00,xf,f_00,dx,fsval,gtol_00,gtol_00 * gtol_00,iVar1);
      bfgs_naive(H,N,eps,xi_00,xf,f,f_00);
      for (retval = 0; retval < N; retval = retval + 1) {
        xi_00[retval] = xf[retval];
        f[retval] = f_00[retval];
      }
    }
    if ((gfdcode == 0) && (MAXITER <= i)) {
      gfdcode = 4;
    }
    free(f);
    free(H);
    free(array);
    free(xi_00);
    free(L_00);
    free(x);
    free(f_00);
    funcpt_local._4_4_ = gfdcode;
  }
  else {
    for (retval = 0; retval < N; retval = retval + 1) {
      xf[retval] = xi[retval];
    }
    funcpt_local._4_4_ = 1;
  }
  return funcpt_local._4_4_;
}

Assistant:

int bfgs_min_naive(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval, double maxstep, int MAXITER,
		double eps,double *xf)  {
	int rcode,iter,gfdcode;
	int i,siter,retval;
	double gtol,stol,dt1,dt2;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*hess,*scheck,*xc,*L,*step,*jacf;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 
	 */ 
	
	rcode = 0;
	iter = 0;
	siter = MAXITER;
	gtol = pow(eps,1.0/3.0);
	
	stol = gtol * gtol;
	eps2 = sqrt(eps);
	gfdcode = 0;
	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt,xi,N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	
	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	
	
	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}
	
	//printf("dt1 dt2 %g \n", maxstep);

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
		return rcode;
	}
	
	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_naive(hess,N,fx,fsval,dx);
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && iter < siter) {
		iter++;
		modelhess(hess,N,dx,eps,L);
		scale(jac,1,N,-1.0);
		//mdisplay(hess,N,N);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);
		//retval = lnsrchmod(funcpt,xc,jac,step,N,dx,maxstep,stol,xf,jacf); 
		retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		
		//retval = swolfe(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		
		fxf = FUNCPT_EVAL(funcpt,xf,N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}
		//printf("%d %g \n",iter,fxf);
		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jacf);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		rcode = stopcheck(fxf,N,xc,xf,jacf,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,hess);
		bfgs_naive(hess,N,eps,xc,xf,jac,jacf);
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			jac[i] = jacf[i];
		}
	}
	
	if (rcode == 0 && iter >= siter) {
		rcode = 4;
	}
	/*
	for(i = 0; i < N;++i) {
		xf[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	*/
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}